

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkAreaNumLines
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec4 *area,int *messageLimitCounter,
          int componentNdx,IVec2 *numLines)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int height;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  MessageBuilder local_398;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208 [4];
  MessageBuilder local_1f8;
  int local_74;
  undefined1 local_70 [4];
  int numMaxima;
  IVec2 numMinimaMaxima;
  ConstPixelBufferAccess subAccess;
  IVec2 *numLines_local;
  int componentNdx_local;
  int *messageLimitCounter_local;
  IVec4 *area_local;
  ConstPixelBufferAccess *access_local;
  LineRenderCase *this_local;
  
  iVar1 = tcu::Vector<int,_4>::x(area);
  iVar2 = tcu::Vector<int,_4>::y(area);
  iVar3 = tcu::Vector<int,_4>::z(area);
  height = tcu::Vector<int,_4>::w(area);
  tcu::getSubregion((ConstPixelBufferAccess *)&numMinimaMaxima,access,iVar1,iVar2,0,iVar3,height,1);
  getNumMinimaMaxima((LineRenderCase *)local_70,(ConstPixelBufferAccess *)this,(int)&numMinimaMaxima
                    );
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_70);
  local_74 = iVar2;
  iVar3 = tcu::Vector<int,_2>::x(numLines);
  iVar1 = local_74;
  if ((iVar3 <= iVar2) && (iVar2 = tcu::Vector<int,_2>::y(numLines), iVar1 <= iVar2)) {
    return true;
  }
  iVar1 = *messageLimitCounter;
  *messageLimitCounter = iVar1 + -1;
  if (-1 < iVar1 + -1) {
    iVar1 = tcu::Vector<int,_4>::z(area);
    if (iVar1 == 1) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_1f8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1f8,(char (*) [11])"On column ");
      local_208[0] = tcu::Vector<int,_4>::x(area);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_208);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])", y: [");
      local_20c = tcu::Vector<int,_4>::y(area);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_20c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c6b075);
      iVar1 = tcu::Vector<int,_4>::y(area);
      local_210 = tcu::Vector<int,_4>::w(area);
      local_210 = iVar1 + local_210;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_210);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2a0365d);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"\tExpected [");
      local_214 = tcu::Vector<int,_2>::x(numLines);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_214);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
      local_218 = tcu::Vector<int,_2>::y(numLines);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_218);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [48])"] lines but the number of lines in the area is ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_74);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f8);
    }
    else {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_398,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_398,(char (*) [8])"On row ");
      local_39c = tcu::Vector<int,_4>::y(area);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_39c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])", x: [");
      local_3a0 = tcu::Vector<int,_4>::x(area);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3a0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c6b075);
      iVar1 = tcu::Vector<int,_4>::x(area);
      local_3a4 = tcu::Vector<int,_4>::z(area);
      local_3a4 = iVar1 + local_3a4;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3a4);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2a0365d);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"\tExpected [");
      local_3a8 = tcu::Vector<int,_2>::x(numLines);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3a8);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
      local_3ac = tcu::Vector<int,_2>::y(numLines);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3ac);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [48])"] lines but the number of lines in the area is ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_74);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_398);
    }
  }
  return false;
}

Assistant:

bool LineRenderCase::checkAreaNumLines (const tcu::ConstPixelBufferAccess& access, const tcu::IVec4& area, int& messageLimitCounter, int componentNdx, const tcu::IVec2& numLines) const
{
	// Num maxima == num lines
	const tcu::ConstPixelBufferAccess	subAccess		= tcu::getSubregion(access, area.x(), area.y(), 0, area.z(), area.w(), 1);
	const tcu::IVec2					numMinimaMaxima	= getNumMinimaMaxima(subAccess, componentNdx);
	const int							numMaxima		= numMinimaMaxima.y();

	// In valid range
	if (numMaxima >= numLines.x() && numMaxima <= numLines.y())
		return true;

	if (--messageLimitCounter < 0)
		return false;

	if (area.z() == 1)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "On column " << area.x() << ", y: [" << area.y() << "," << (area.y()+area.w()) << "):\n"
				<< "\tExpected [" << numLines.x() << ", " << numLines.y() << "] lines but the number of lines in the area is " << numMaxima
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "On row " << area.y() << ", x: [" << area.x() << "," << (area.x()+area.z()) << "):\n"
				<< "\tExpected [" << numLines.x() << ", " << numLines.y() << "] lines but the number of lines in the area is " << numMaxima
			<< tcu::TestLog::EndMessage;

	return false;
}